

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ATTRIBUTE *pAVar4;
  long lVar5;
  uint uVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  int iVar7;
  int iVar8;
  
  pAVar4 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar4 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar7 = 0;
  uVar6 = bVar1 - 5;
  if (uVar6 < 0x14) {
    iVar8 = 0;
    switch((uint)bVar1) {
    case 5:
      if (pAVar4 == (ATTRIBUTE *)&DAT_00000001) {
        return -2;
      }
      iVar2 = (*enc[3].nameLength)(enc,ptr);
      iVar8 = iVar7;
      if (iVar2 == 0) {
        iVar2 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_00,&pAVar4->name);
        while( true ) {
          lVar5 = 2;
          while( true ) {
            iVar8 = iVar7;
            if (iVar2 == 0) goto switchD_0075d949_caseD_8;
LAB_0075da0b:
            while( true ) {
              ptr = (char *)((byte *)ptr + lVar5);
              lVar5 = (long)end - (long)ptr;
              if (lVar5 < 1) {
                return -1;
              }
              pAVar4 = (ATTRIBUTE *)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)&pAVar4->name + (long)enc[1].scanners);
              if (bVar1 < 0x12) break;
              lVar5 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar8 = iVar7;
                if (bVar1 == 0x12) {
                  ptr = (char *)((byte *)ptr + 1);
                  iVar8 = 0x1c;
                }
                goto switchD_0075d949_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (lVar5 < 3) {
                return -2;
              }
              pcVar3 = (*enc[3].skipS)(enc,ptr);
              iVar8 = iVar7;
              if ((int)pcVar3 != 0) goto switchD_0075d949_caseD_8;
              iVar2 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_03,&pAVar4->name);
LAB_0075dadb:
              lVar5 = 3;
            }
            else {
              iVar8 = iVar7;
              if (bVar1 != 7) goto switchD_0075d949_caseD_8;
              if (lVar5 < 4) {
                return -2;
              }
              iVar2 = (*enc[3].getAtts)(enc,ptr,(uint)bVar1,pAVar4);
              if (iVar2 != 0) goto switchD_0075d949_caseD_8;
              iVar2 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_02,&pAVar4->name);
LAB_0075da9c:
              lVar5 = 4;
            }
          }
          if (lVar5 == 1) {
            return -2;
          }
          iVar2 = (*enc[3].nameLength)(enc,ptr);
          iVar8 = iVar7;
          if (iVar2 != 0) break;
          iVar2 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_04,&pAVar4->name);
        }
      }
      break;
    case 6:
      if ((long)pAVar4 < 3) {
        return -2;
      }
      pcVar3 = (*enc[3].skipS)(enc,ptr);
      iVar8 = iVar7;
      if ((int)pcVar3 == 0) {
        iVar2 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX,&pAVar4->name);
        goto LAB_0075dadb;
      }
      break;
    case 7:
      if ((long)pAVar4 < 4) {
        return -2;
      }
      iVar2 = (*enc[3].getAtts)(enc,ptr,(&switchD_0075d949::switchdataD_009a4bc8)[uVar6] + 0x9a4bc8,
                                pAVar4);
      iVar8 = iVar7;
      if (iVar2 == 0) {
        iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_01,(char *)pAVar4);
        goto LAB_0075da9c;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0075d949_caseD_9;
    case 0x16:
    case 0x18:
      lVar5 = 1;
      goto LAB_0075da0b;
    }
  }
  else {
    iVar8 = iVar7;
    if (bVar1 != 0x1e) goto switchD_0075d949_caseD_8;
switchD_0075d949_caseD_9:
    iVar8 = 0x16;
  }
switchD_0075d949_caseD_8:
  *nextTokPtr = ptr;
  return iVar8;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}